

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::er_mixed_decoding
               (search *sch,multi_ex *ec,v_array<unsigned_long> *predictions)

{
  ptag pVar1;
  uint uVar2;
  int iVar3;
  pointer ppeVar4;
  size_t sVar5;
  uint uVar6;
  pointer ppeVar7;
  long lVar8;
  v_array<unsigned_long> *pvVar9;
  v_array<unsigned_long> *extraout_RDX;
  v_array<unsigned_long> *extraout_RDX_00;
  uint uVar10;
  ptag i;
  ptag my_tag;
  ulong uVar11;
  ptag pVar12;
  uint uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  
  ppeVar7 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  lVar8 = (long)ppeVar4 + (1 - (long)ppeVar7);
  auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar15._0_8_ = lVar8;
  auVar15._12_4_ = 0x45300000;
  pVar1 = (ptag)(long)((SQRT((auVar15._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) + -1.0)
                      * 0.5);
  pvVar9 = (v_array<unsigned_long> *)(ulong)(pVar1 - 1);
  uVar11 = 0;
  do {
    iVar14 = (int)uVar11;
    if ((ulong)((long)ppeVar4 - (long)ppeVar7 >> 3) <= uVar11) {
      return;
    }
    iVar3 = 0;
    uVar11 = 0;
    uVar10 = pVar1 - 1;
    while (my_tag = (ptag)uVar11, my_tag != pVar1) {
      if (iVar3 == iVar14) {
        sVar5 = predict_entity(sch,(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar11],pvVar9,my_tag,
                               false);
        predictions->_begin[uVar11] = sVar5;
        pvVar9 = extraout_RDX_00;
        break;
      }
      uVar6 = 0;
      pVar12 = 0;
      uVar13 = uVar10;
      uVar2 = pVar1 * 2;
      while( true ) {
        uVar2 = uVar2 - 2;
        iVar3 = iVar3 + 1;
        pvVar9 = (v_array<unsigned_long> *)(ulong)uVar2;
        if (my_tag == pVar12) break;
        if (iVar14 == iVar3) {
          uVar13 = uVar13 + (uVar6 >> 1);
          sVar5 = predict_relation(sch,(ec->
                                       super__Vector_base<example_*,_std::allocator<example_*>_>).
                                       _M_impl.super__Vector_impl_data._M_start[uVar13],predictions,
                                   uVar13,false);
          predictions->_begin[uVar13] = sVar5;
          pvVar9 = extraout_RDX;
          iVar3 = iVar14;
          break;
        }
        pVar12 = pVar12 + 1;
        uVar13 = uVar13 - 1;
        uVar6 = uVar6 + uVar2;
      }
      uVar10 = uVar10 + 1;
      uVar11 = (ulong)(my_tag + 1);
    }
    uVar11 = (ulong)(iVar14 + 1);
    ppeVar7 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppeVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void er_mixed_decoding(Search::search& sch, multi_ex& ec, v_array<size_t>& predictions)
{
  // ec.size = #entity + #entity*(#entity-1)/2
  uint32_t n_ent = (uint32_t)((sqrt(ec.size() * 8 + 1) - 1) / 2);
  for (uint32_t t = 0; t < ec.size(); t++)
  {
    // Do entity recognition first
    uint32_t count = 0;
    for (ptag i = 0; i < n_ent; i++)
    {
      if (count == t)
      {
        predictions[i] = predict_entity(sch, ec[i], predictions, i);
        break;
      }
      count++;
      for (uint32_t j = 0; j < i; j++)
      {
        if (count == t)
        {
          ptag rel_index = (ptag)(n_ent + (2 * n_ent - j - 1) * j / 2 + i - j - 1);
          predictions[rel_index] = predict_relation(sch, ec[rel_index], predictions, rel_index);
          break;
        }
        count++;
      }
    }
  }
}